

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

shared_ptr<Instance> * __thiscall
VectorInstance::op_eraseFromIndex_toIndex
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  undefined8 *puVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  const_iterator in_RDI;
  __normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  *this_00;
  int to_index;
  int from_index;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_fffffffffffffe88;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  *in_stack_fffffffffffffe98;
  allocator *paVar7;
  const_iterator __first;
  string *in_stack_fffffffffffffed8;
  IntegerInstance *in_stack_fffffffffffffee0;
  IntegerInstance local_e8;
  int local_84;
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  __first._M_current = in_RDI._M_current;
  local_18 = in_RDX;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar5 != 2) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar3 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c0f52);
  local_1c = iVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,1);
  IntegerInstance::IntegerInstance(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar4 = IntegerInstance::value(&local_e8);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c0f9d);
  iVar2 = local_1c;
  local_84 = iVar4;
  if (-1 < local_1c) {
    sVar5 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
            size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 (in_RSI + 0x78));
    iVar1 = local_84;
    if (iVar2 <= (int)sVar5) {
      if (-1 < local_84) {
        sVar5 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                ::size((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                        *)(in_RSI + 0x78));
        if (iVar1 <= (int)sVar5) {
          if (local_84 - local_1c < 0) {
            puVar6 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar6 = "RuntimeError: invalid argument.";
            __cxa_throw(puVar6,&char_const*::typeinfo,0);
          }
          this_00 = (__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                     *)(in_RSI + 0x78);
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                    (in_stack_fffffffffffffe88);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
          ::operator+(in_stack_fffffffffffffe98,(difference_type)this_00);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
          ::__normal_iterator<std::shared_ptr<Instance>*>
                    (this_00,(__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                              *)in_stack_fffffffffffffe88);
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                    (in_stack_fffffffffffffe88);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
          ::operator+(in_stack_fffffffffffffe98,(difference_type)this_00);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
          ::__normal_iterator<std::shared_ptr<Instance>*>
                    (this_00,(__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                              *)in_stack_fffffffffffffe88);
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::erase
                    ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                      *)CONCAT44(iVar4,iVar3),__first,in_RDI);
          paVar7 = (allocator *)&stack0xfffffffffffffedf;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)in_RDI._M_current,"null",paVar7);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
          return __first._M_current;
        }
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = "RuntimeError: invalid argument.";
      __cxa_throw(puVar6,&char_const*::typeinfo,0);
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_eraseFromIndex_toIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    int to_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index < 0 || to_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index - from_index < 0)
        throw EXC_INVALID_ARGUMENT;
    _value.erase(_value.begin() + from_index, _value.begin() + to_index);
    return "null";
}